

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_dn_gets(char *buf,size_t size,mbedtls_x509_name *dn)

{
  byte bVar1;
  int iVar2;
  ulong __maxlen;
  char *__format;
  char *local_160;
  char *p;
  char s [256];
  char *short_name;
  mbedtls_x509_name *name;
  uchar merge;
  size_t sStack_40;
  uchar c;
  size_t n;
  size_t i;
  int ret;
  mbedtls_x509_name *dn_local;
  size_t size_local;
  char *buf_local;
  
  name._6_1_ = '\0';
  s[0xf8] = '\0';
  s[0xf9] = '\0';
  s[0xfa] = '\0';
  s[0xfb] = '\0';
  s[0xfc] = '\0';
  s[0xfd] = '\0';
  s[0xfe] = '\0';
  s[0xff] = '\0';
  memset(&p,0,0x100);
  local_160 = buf;
  short_name = (char *)dn;
  sStack_40 = size;
  while( true ) {
    while( true ) {
      if (short_name == (char *)0x0) {
        return (int)size - (int)sStack_40;
      }
      if (*(long *)(short_name + 0x10) != 0) break;
      short_name = *(char **)(short_name + 0x30);
    }
    if ((mbedtls_x509_name *)short_name != dn) {
      __format = ", ";
      if (name._6_1_ != '\0') {
        __format = " + ";
      }
      iVar2 = snprintf(local_160,sStack_40,__format);
      if ((iVar2 < 0) || (sStack_40 <= (ulong)(long)iVar2)) {
        return -0x2980;
      }
      sStack_40 = sStack_40 - (long)iVar2;
      local_160 = local_160 + iVar2;
    }
    iVar2 = mbedtls_oid_get_attr_short_name((mbedtls_asn1_buf *)short_name,(char **)(s + 0xf8));
    if (iVar2 == 0) {
      i._4_4_ = snprintf(local_160,sStack_40,"%s=",s._248_8_);
    }
    else {
      i._4_4_ = snprintf(local_160,sStack_40,"??=");
    }
    if ((i._4_4_ < 0) || (sStack_40 <= (ulong)(long)i._4_4_)) break;
    __maxlen = sStack_40 - (long)i._4_4_;
    for (n = 0; (n < *(ulong *)(short_name + 0x20) && (n < 0xff)); n = n + 1) {
      bVar1 = *(byte *)(*(long *)(short_name + 0x28) + n);
      if (((bVar1 < 0x20) || (bVar1 == 0x7f)) || ((0x80 < bVar1 && (bVar1 < 0xa0)))) {
        s[n - 8] = '?';
      }
      else {
        s[n - 8] = bVar1;
      }
    }
    s[n - 8] = '\0';
    iVar2 = snprintf(local_160 + i._4_4_,__maxlen,"%s",&p);
    if ((iVar2 < 0) || (__maxlen <= (ulong)(long)iVar2)) {
      return -0x2980;
    }
    sStack_40 = __maxlen - (long)iVar2;
    local_160 = local_160 + i._4_4_ + iVar2;
    name._6_1_ = short_name[0x38];
    short_name = *(char **)(short_name + 0x30);
  }
  return -0x2980;
}

Assistant:

int mbedtls_x509_dn_gets( char *buf, size_t size, const mbedtls_x509_name *dn )
{
    int ret;
    size_t i, n;
    unsigned char c, merge = 0;
    const mbedtls_x509_name *name;
    const char *short_name = NULL;
    char s[MBEDTLS_X509_MAX_DN_NAME_SIZE], *p;

    memset( s, 0, sizeof( s ) );

    name = dn;
    p = buf;
    n = size;

    while( name != NULL )
    {
        if( !name->oid.p )
        {
            name = name->next;
            continue;
        }

        if( name != dn )
        {
            ret = mbedtls_snprintf( p, n, merge ? " + " : ", " );
            MBEDTLS_X509_SAFE_SNPRINTF;
        }

        ret = mbedtls_oid_get_attr_short_name( &name->oid, &short_name );

        if( ret == 0 )
            ret = mbedtls_snprintf( p, n, "%s=", short_name );
        else
            ret = mbedtls_snprintf( p, n, "\?\?=" );
        MBEDTLS_X509_SAFE_SNPRINTF;

        for( i = 0; i < name->val.len; i++ )
        {
            if( i >= sizeof( s ) - 1 )
                break;

            c = name->val.p[i];
            if( c < 32 || c == 127 || ( c > 128 && c < 160 ) )
                 s[i] = '?';
            else s[i] = c;
        }
        s[i] = '\0';
        ret = mbedtls_snprintf( p, n, "%s", s );
        MBEDTLS_X509_SAFE_SNPRINTF;

        merge = name->next_merged;
        name = name->next;
    }

    return( (int) ( size - n ) );
}